

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O3

int zdd_group_move(DdManager *table,int x,int y,Move **moves)

{
  Move *pMVar1;
  Move *pMVar2;
  int iVar3;
  DdNode *pDVar4;
  DdSubtable *pDVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  DdHalfWord DVar10;
  uint y_00;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar11;
  
  uVar18 = (ulong)(uint)y;
  pDVar5 = table->subtableZ;
  uVar14 = (ulong)(int)pDVar5[x].next;
  uVar16 = pDVar5[y].next;
  do {
    uVar8 = (ulong)uVar16;
    uVar16 = pDVar5[(int)uVar16].next;
  } while (uVar16 != y);
  uVar16 = 0xffffffff;
  uVar11 = 0xffffffff;
  DVar10 = 0xffffffff;
  uVar7 = (long)x;
  if (x <= y) {
    do {
      lVar6 = (long)(int)uVar18;
      uVar15 = uVar14 & 0xffffffff;
      uVar12 = uVar7;
      uVar9 = uVar18;
      if ((long)uVar14 < lVar6) {
        do {
          uVar18 = uVar12;
          uVar11 = uVar9 & 0xffffffff;
          y_00 = (uint)uVar9;
          pDVar5 = table->subtableZ;
          uVar17 = pDVar5[uVar18].next;
          uVar12 = uVar15;
          do {
            iVar3 = (int)uVar12;
            uVar12 = (ulong)pDVar5[iVar3].next;
            uVar16 = (uint)uVar18;
          } while (pDVar5[iVar3].next != uVar16);
          if (uVar17 == uVar16) {
            uVar17 = y_00;
          }
          pDVar5[iVar3].next = y_00;
          uVar13 = pDVar5[(int)y_00].next;
          if (pDVar5[(int)y_00].next == y_00) {
            uVar13 = uVar16;
          }
          pDVar5[uVar18].next = uVar13;
          uVar9 = uVar18 & 0xffffffff;
          if ((uint)uVar8 != y_00) {
            pDVar5[(int)(uint)uVar8].next = uVar16;
            uVar9 = uVar8;
          }
          pDVar5[(int)y_00].next = uVar17;
          iVar3 = cuddZddSwapInPlace(table,uVar16,y_00);
          if (iVar3 == 0) goto LAB_0093b537;
          uVar12 = uVar18 - 1;
          uVar8 = uVar9;
          uVar9 = uVar18;
        } while ((long)uVar14 < (long)uVar18);
        pDVar5 = table->subtableZ;
        lVar6 = (long)(int)uVar16;
      }
      DVar10 = (DdHalfWord)uVar11;
      uVar17 = (uint)uVar18;
      uVar18 = uVar18 & 0xffffffff;
      if (uVar17 < pDVar5[lVar6].next) {
        uVar18 = (ulong)pDVar5[lVar6].next;
      }
      uVar14 = uVar14 + 1;
      iVar3 = (int)uVar7;
      uVar7 = uVar7 + 1;
      uVar8 = uVar15;
    } while (iVar3 < (int)uVar18);
  }
  pDVar4 = cuddDynamicAllocNode(table);
  if (pDVar4 == (DdNode *)0x0) {
LAB_0093b537:
    uVar16 = 0;
    pMVar2 = *moves;
    while (pMVar2 != (Move *)0x0) {
      pMVar1 = pMVar2->next;
      pMVar2->y = 0;
      *(DdNode **)&pMVar2->flags = table->nextFree;
      table->nextFree = (DdNode *)*moves;
      *moves = pMVar1;
      pMVar2 = pMVar1;
    }
  }
  else {
    pDVar4->index = uVar16;
    pDVar4->ref = DVar10;
    uVar16 = table->keysZ;
    *(uint *)((long)&pDVar4->next + 4) = uVar16;
    (pDVar4->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar4;
  }
  return uVar16;
}

Assistant:

static int
zdd_group_move(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move        *move;
    int         size;
    int         i, temp, gxtop, gxbot, gybot, yprev;
    int         swapx = -1, swapy = -1;

#ifdef DD_DEBUG
    assert(x < y);      /* we assume that x < y */
#endif
    /* Find top and bottom for the two groups. */
    gxtop = table->subtableZ[x].next;
    gxbot = x;
    gybot = table->subtableZ[y].next;
    while (table->subtableZ[gybot].next != (unsigned) y)
        gybot = table->subtableZ[gybot].next;
    yprev = gybot;

    while (x <= y) {
        while (y > gxtop) {
            /* Set correct symmetries. */
            temp = table->subtableZ[x].next;
            if (temp == x)
                temp = y;
            i = gxtop;
            for (;;) {
                if (table->subtableZ[i].next == (unsigned) x) {
                    table->subtableZ[i].next = y;
                    break;
                } else {
                    i = table->subtableZ[i].next;
                }
            }
            if (table->subtableZ[y].next != (unsigned) y) {
                table->subtableZ[x].next = table->subtableZ[y].next;
            } else {
                table->subtableZ[x].next = x;
            }

            if (yprev != y) {
                table->subtableZ[yprev].next = x;
            } else {
                yprev = x;
            }
            table->subtableZ[y].next = temp;

            size = cuddZddSwapInPlace(table, x, y);
            if (size == 0)
                goto zdd_group_moveOutOfMem;
            swapx = x;
            swapy = y;
            y = x;
            x--;
        } /* while y > gxtop */

        /* Trying to find the next y. */
        if (table->subtableZ[y].next <= (unsigned) y) {
            gybot = y;
        } else {
            y = table->subtableZ[y].next;
        }

        yprev = gxtop;
        gxtop++;
        gxbot++;
        x = gxbot;
    } /* while x <= y, end of group movement */
    move = (Move *)cuddDynamicAllocNode(table);
    if (move == NULL)
        goto zdd_group_moveOutOfMem;
    move->x = swapx;
    move->y = swapy;
    move->size = table->keysZ;
    move->next = *moves;
    *moves = move;

    return(table->keysZ);

zdd_group_moveOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}